

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

int xmlHashAddEntry2(xmlHashTablePtr hash,xmlChar *key,xmlChar *key2,void *payload)

{
  undefined4 local_2c;
  int res;
  void *payload_local;
  xmlChar *key2_local;
  xmlChar *key_local;
  xmlHashTablePtr hash_local;
  
  local_2c = xmlHashUpdateInternal(hash,key,key2,(xmlChar *)0x0,payload,(xmlHashDeallocator)0x0,0);
  if (local_2c == 0) {
    local_2c = -1;
  }
  else if (local_2c == 1) {
    local_2c = 0;
  }
  return local_2c;
}

Assistant:

int
xmlHashAddEntry2(xmlHashTablePtr hash, const xmlChar *key,
                 const xmlChar *key2, void *payload) {
    int res = xmlHashUpdateInternal(hash, key, key2, NULL, payload, NULL, 0);

    if (res == 0)
        res = -1;
    else if (res == 1)
        res = 0;

    return(res);
}